

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O0

int src_simple(SRC_DATA *src_data,int converter,int channels)

{
  SRC_DATA *data;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int error;
  SRC_STATE *src_state;
  undefined4 local_24;
  int *in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  data = (SRC_DATA *)src_new(in_ESI,in_EDX,in_stack_ffffffffffffffe0);
  if (data == (SRC_DATA *)0x0) {
    local_4 = local_24;
  }
  else {
    *(undefined4 *)(in_RDI + 0x30) = 1;
    local_4 = src_process((SRC_STATE *)CONCAT44(in_ESI,in_EDX),data);
    src_delete((SRC_STATE *)data);
  }
  return local_4;
}

Assistant:

int
src_simple (SRC_DATA *src_data, int converter, int channels)
{	SRC_STATE	*src_state ;
	int 		error ;

	if ((src_state = src_new (converter, channels, &error)) == NULL)
		return error ;

	src_data->end_of_input = 1 ; /* Only one buffer worth of input. */

	error = src_process (src_state, src_data) ;

	src_delete (src_state) ;

	return error ;
}